

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void gt_tval_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,int timeridx,uint64_t value)

{
  uint64_t uVar1;
  int64_t iVar2;
  ArchCPU_conflict2 *cpu;
  uint64_t local_30;
  uint64_t offset;
  uint64_t value_local;
  int timeridx_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  local_30 = 0;
  if ((timeridx == 1) || (timeridx == 4)) {
    local_30 = gt_virt_cnt_offset(env);
  }
  uVar1 = gt_get_countervalue(env);
  iVar2 = sextract64(value,0,0x20);
  (env->cp15).c14_timer[timeridx].cval = (uVar1 - local_30) + iVar2;
  cpu = env_archcpu(env);
  gt_recalc_timer(cpu,timeridx);
  return;
}

Assistant:

static void gt_tval_write(CPUARMState *env, const ARMCPRegInfo *ri,
                          int timeridx,
                          uint64_t value)
{
    uint64_t offset = 0;

    switch (timeridx) {
    case GTIMER_VIRT:
    case GTIMER_HYPVIRT:
        offset = gt_virt_cnt_offset(env);
        break;
    }

    env->cp15.c14_timer[timeridx].cval = gt_get_countervalue(env) - offset +
                                         sextract64(value, 0, 32);
    gt_recalc_timer(env_archcpu(env), timeridx);
}